

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

OneHotLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_onehot(NeuralNetworkLayer *this)

{
  bool bVar1;
  OneHotLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_onehot(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_onehot(this);
    this_00 = (OneHotLayerParams *)operator_new(0x30);
    OneHotLayerParams::OneHotLayerParams(this_00);
    (this->layer_).onehot_ = this_00;
  }
  return (OneHotLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::OneHotLayerParams* NeuralNetworkLayer::mutable_onehot() {
  if (!has_onehot()) {
    clear_layer();
    set_has_onehot();
    layer_.onehot_ = new ::CoreML::Specification::OneHotLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.oneHot)
  return layer_.onehot_;
}